

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

void ffcfmt(char *tform,char *cform)

{
  char cVar1;
  ushort uVar2;
  ushort **ppuVar3;
  size_t sVar4;
  uint uVar5;
  ushort uVar6;
  ulong uVar7;
  ulong uVar8;
  
  *cform = '\0';
  uVar8 = 0;
  while( true ) {
    uVar5 = (byte)tform[uVar8] - 0x20;
    if (0x29 < uVar5) break;
    if ((ulong)uVar5 != 0) {
      if ((0x27200000000U >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
        uVar2 = 1;
        goto LAB_00177943;
      }
      break;
    }
    uVar8 = uVar8 + 1;
  }
  if (tform[uVar8] != 0) {
    uVar2 = 0;
LAB_00177943:
    uVar7 = uVar8 & 0xffffffff;
    uVar6 = 1;
    while (uVar7 = uVar7 + 1, uVar2 != 0) {
      cVar1 = tform[uVar7];
      if (cVar1 == '\0') {
        *cform = '%';
        strcpy(cform + 1,tform + (uVar8 + 1 & 0xffffffff));
        cVar1 = tform[uVar8];
        if (cVar1 == 'I') {
          sVar4 = strlen(cform);
          builtin_strncpy(cform + sVar4,".0f",4);
        }
        else {
          if (cVar1 != 'A') goto LAB_001779d2;
          sVar4 = strlen(cform);
          (cform + sVar4)[0] = 's';
          (cform + sVar4)[1] = '\0';
        }
        cVar1 = tform[uVar8];
LAB_001779d2:
        if (cVar1 == 'F') {
          sVar4 = strlen(cform);
          (cform + sVar4)[0] = 'f';
          (cform + sVar4)[1] = '\0';
          cVar1 = tform[uVar8];
        }
        if (cVar1 == 'E') {
          sVar4 = strlen(cform);
          (cform + sVar4)[0] = 'E';
          (cform + sVar4)[1] = '\0';
          cVar1 = tform[uVar8];
        }
        if (cVar1 != 'D') {
          return;
        }
        sVar4 = strlen(cform);
        (cform + sVar4)[0] = 'E';
        (cform + sVar4)[1] = '\0';
        return;
      }
      if (cVar1 == '.') {
        uVar2 = uVar6;
        uVar6 = 0;
      }
      else {
        ppuVar3 = __ctype_b_loc();
        uVar2 = (*ppuVar3)[cVar1] >> 0xb & 1;
      }
    }
  }
  return;
}

Assistant:

void ffcfmt(char *tform,    /* value of an ASCII table TFORMn keyword */
            char *cform)    /* equivalent format code in C language syntax */
/*
  convert the FITS format string for an ASCII Table extension column into the
  equivalent C format string that can be used in a printf statement, after
  the values have been read as a double.
*/
{
    int ii, istart, isgood, npt;
    
    cform[0] = '\0';
    ii = 0;
    while (tform[ii] != 0 && tform[ii] == ' ') /* find first non-blank char */
         ii++;

    if (tform[ii] == 0)
        return;    /* input format string was blank */
    istart = ii;
    
    isgood = 1;
    npt = 0;
    if (tform[ii] != 'A' && tform[ii] != 'I' && tform[ii] != 'F'
                 && tform[ii] != 'E' && tform[ii] != 'D')
       isgood = 0;
    ii++;
    while (isgood && tform[ii] != 0)
    {
       /* one period is allowed */
       if (tform[ii] == '.')
       {
          if (npt > 0)
            isgood = 0;
          else
            ++npt; 
       }
       else if (!isdigit(tform[ii]))
          isgood = 0;
       ++ii; 
    }
    if (!isgood)
       return;

    cform[0] = '%';  /* start the format string */

    strcpy(&cform[1], &tform[istart + 1]); /* append the width and decimal code */


    if (tform[istart] == 'A')
        strcat(cform, "s");
    else if (tform[istart] == 'I')
        strcat(cform, ".0f");  /*  0 precision to suppress decimal point */
    if (tform[istart] == 'F')
        strcat(cform, "f");
    if (tform[istart] == 'E')
        strcat(cform, "E");
    if (tform[istart] == 'D')
        strcat(cform, "E");

    return;
}